

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

void __thiscall
NNTreeIterator::resetLimits(NNTreeIterator *this,QPDFObjectHandle *node,iterator parent)

{
  NNTreeDetails *pNVar1;
  QPDF *qpdf;
  bool bVar2;
  byte bVar3;
  int iVar4;
  pointer pPVar5;
  bool local_421;
  byte local_402;
  int local_33c;
  int local_324;
  _Self local_2f8;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  _List_iterator<NNTreeIterator::PathElement> local_2a0;
  byte local_291;
  QPDFObjectHandle local_290;
  byte local_279;
  QPDFObjectHandle local_278;
  byte local_261;
  QPDFObjectHandle local_260;
  byte local_249;
  QPDFObjectHandle local_248;
  byte local_231;
  QPDFObjectHandle local_230;
  QPDFObjectHandle local_220;
  undefined1 local_210 [8];
  QPDFObjectHandle olast;
  QPDFObjectHandle ofirst;
  string local_1e8 [32];
  undefined1 local_1c8 [8];
  QPDFObjectHandle olimits;
  QPDFObjectHandle limits;
  QPDFObjectHandle local_198;
  allocator<char> local_181;
  string local_180 [32];
  undefined1 local_160 [8];
  QPDFObjectHandle last_limits;
  string local_148 [32];
  undefined1 local_128 [8];
  QPDFObjectHandle first_limits;
  QPDFObjectHandle last_kid;
  QPDFObjectHandle first_kid;
  QPDFObjectHandle local_e8;
  undefined1 local_d8 [8];
  QPDFObjectHandle last;
  QPDFObjectHandle first;
  undefined1 local_b0 [3];
  bool changed;
  int nitems;
  QPDFObjectHandle items;
  int nkids;
  undefined1 local_78 [8];
  QPDFObjectHandle kids;
  allocator<char> local_51;
  string local_50;
  _Self local_30;
  byte local_21;
  QPDFObjectHandle *pQStack_20;
  bool done;
  QPDFObjectHandle *node_local;
  NNTreeIterator *this_local;
  iterator parent_local;
  
  local_21 = 0;
  pQStack_20 = node;
  node_local = (QPDFObjectHandle *)this;
  this_local = (NNTreeIterator *)parent._M_node;
  while( true ) {
    if (((local_21 ^ 0xff) & 1) == 0) {
      return;
    }
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::end
                   (&this->path);
    bVar2 = std::operator==((_Self *)&this_local,&local_30);
    if (bVar2) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nkids,"/Kids",
               (allocator<char> *)
               ((long)&items.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_78,(string *)node);
    std::__cxx11::string::~string((string *)&nkids);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&items.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    bVar2 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_78);
    if (bVar2) {
      local_324 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_78);
    }
    else {
      local_324 = 0;
    }
    items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ = local_324;
    (*(code *)**(undefined8 **)this->impl->details)();
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_b0,(string *)node);
    bVar2 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_b0);
    if (bVar2) {
      local_33c = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_b0);
    }
    else {
      local_33c = 0;
    }
    first.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._3_1_ = true;
    QPDFObjectHandle::QPDFObjectHandle
              ((QPDFObjectHandle *)
               &last.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_d8);
    if (local_33c < 2) {
      if (0 < (int)items.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
        QPDFObjectHandle::getArrayItem
                  ((QPDFObjectHandle *)
                   &last_kid.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (int)local_78);
        QPDFObjectHandle::getArrayItem
                  ((QPDFObjectHandle *)
                   &first_limits.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (int)local_78);
        bVar2 = QPDFObjectHandle::isDictionary
                          ((QPDFObjectHandle *)
                           &last_kid.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        if ((bVar2) &&
           (bVar2 = QPDFObjectHandle::isDictionary
                              ((QPDFObjectHandle *)
                               &first_limits.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount), bVar2)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_148,"/Limits",
                     (allocator<char> *)
                     ((long)&last_limits.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 7));
          QPDFObjectHandle::getKey
                    ((QPDFObjectHandle *)local_128,
                     (string *)
                     &last_kid.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__cxx11::string::~string(local_148);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&last_limits.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 7));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_180,"/Limits",&local_181);
          QPDFObjectHandle::getKey
                    ((QPDFObjectHandle *)local_160,
                     (string *)
                     &first_limits.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__cxx11::string::~string(local_180);
          std::allocator<char>::~allocator(&local_181);
          bVar2 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_128);
          if ((bVar2) &&
             (((iVar4 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_128), 1 < iVar4
               && (bVar2 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_160), bVar2)) &&
              (iVar4 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_160), 1 < iVar4)))
             ) {
            QPDFObjectHandle::getArrayItem(&local_198,(int)local_128);
            QPDFObjectHandle::operator=
                      ((QPDFObjectHandle *)
                       &last.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       &local_198);
            QPDFObjectHandle::~QPDFObjectHandle(&local_198);
            QPDFObjectHandle::getArrayItem
                      ((QPDFObjectHandle *)
                       &limits.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (int)local_160);
            QPDFObjectHandle::operator=
                      ((QPDFObjectHandle *)local_d8,
                       (QPDFObjectHandle *)
                       &limits.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            QPDFObjectHandle::~QPDFObjectHandle
                      ((QPDFObjectHandle *)
                       &limits.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          }
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_160);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_128);
        }
        QPDFObjectHandle::~QPDFObjectHandle
                  ((QPDFObjectHandle *)
                   &first_limits.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDFObjectHandle::~QPDFObjectHandle
                  ((QPDFObjectHandle *)
                   &last_kid.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
    }
    else {
      QPDFObjectHandle::getArrayItem(&local_e8,(int)local_b0);
      QPDFObjectHandle::operator=
                ((QPDFObjectHandle *)
                 &last.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&local_e8);
      QPDFObjectHandle::~QPDFObjectHandle(&local_e8);
      QPDFObjectHandle::getArrayItem
                ((QPDFObjectHandle *)
                 &first_kid.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (int)local_b0);
      QPDFObjectHandle::operator=
                ((QPDFObjectHandle *)local_d8,
                 (QPDFObjectHandle *)
                 &first_kid.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &first_kid.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    bVar2 = ::qpdf::BaseHandle::operator_cast_to_bool
                      ((BaseHandle *)
                       &last.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if ((bVar2) &&
       (bVar2 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_d8), bVar2)) {
      QPDFObjectHandle::newArray();
      QPDFObjectHandle::appendItem
                ((QPDFObjectHandle *)
                 &olimits.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (QPDFObjectHandle *)
                 &last.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::appendItem
                ((QPDFObjectHandle *)
                 &olimits.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (QPDFObjectHandle *)local_d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1e8,"/Limits",
                 (allocator<char> *)
                 ((long)&ofirst.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1c8,(string *)node);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&ofirst.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      bVar2 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_1c8);
      if ((bVar2) &&
         (iVar4 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_1c8), iVar4 == 2)) {
        QPDFObjectHandle::getArrayItem
                  ((QPDFObjectHandle *)
                   &olast.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (int)local_1c8);
        QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_210,(int)local_1c8);
        pNVar1 = this->impl->details;
        QPDFObjectHandle::QPDFObjectHandle
                  (&local_220,
                   (QPDFObjectHandle *)
                   &olast.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        local_231 = 0;
        local_249 = 0;
        local_261 = 0;
        local_279 = 0;
        local_291 = 0;
        bVar3 = (**(code **)(*(long *)pNVar1 + 8))(pNVar1,&local_220);
        bVar2 = false;
        if ((bVar3 & 1) != 0) {
          pNVar1 = this->impl->details;
          QPDFObjectHandle::QPDFObjectHandle(&local_230,(QPDFObjectHandle *)local_210);
          local_231 = 1;
          bVar3 = (**(code **)(*(long *)pNVar1 + 8))(pNVar1,&local_230);
          bVar2 = false;
          if ((bVar3 & 1) != 0) {
            pNVar1 = this->impl->details;
            QPDFObjectHandle::QPDFObjectHandle
                      (&local_248,
                       (QPDFObjectHandle *)
                       &last.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            local_249 = 1;
            QPDFObjectHandle::QPDFObjectHandle
                      (&local_260,
                       (QPDFObjectHandle *)
                       &olast.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            local_261 = 1;
            iVar4 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_248,&local_260);
            bVar2 = false;
            if (iVar4 == 0) {
              pNVar1 = this->impl->details;
              QPDFObjectHandle::QPDFObjectHandle(&local_278,(QPDFObjectHandle *)local_d8);
              local_279 = 1;
              QPDFObjectHandle::QPDFObjectHandle(&local_290,(QPDFObjectHandle *)local_210);
              local_291 = 1;
              iVar4 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_278,&local_290);
              bVar2 = iVar4 == 0;
            }
          }
        }
        if ((local_291 & 1) != 0) {
          QPDFObjectHandle::~QPDFObjectHandle(&local_290);
        }
        if ((local_279 & 1) != 0) {
          QPDFObjectHandle::~QPDFObjectHandle(&local_278);
        }
        if ((local_261 & 1) != 0) {
          QPDFObjectHandle::~QPDFObjectHandle(&local_260);
        }
        if ((local_249 & 1) != 0) {
          QPDFObjectHandle::~QPDFObjectHandle(&local_248);
        }
        if ((local_231 & 1) != 0) {
          QPDFObjectHandle::~QPDFObjectHandle(&local_230);
        }
        QPDFObjectHandle::~QPDFObjectHandle(&local_220);
        if (bVar2) {
          QTC::TC("qpdf","NNTree limits didn\'t change",0);
        }
        first.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._3_1_ = !bVar2;
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_210);
        QPDFObjectHandle::~QPDFObjectHandle
                  ((QPDFObjectHandle *)
                   &olast.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      local_402 = 0;
      if (first.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._3_1_) {
        local_2a0._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::begin
                       (&this->path);
        pPVar5 = std::_List_iterator<NNTreeIterator::PathElement>::operator->(&local_2a0);
        bVar2 = QPDFObjectHandle::isSameObjectAs(node,&pPVar5->node);
        local_402 = bVar2 ^ 0xff;
      }
      if ((local_402 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2c0,"/Limits",&local_2c1);
        QPDFObjectHandle::replaceKey
                  (node,&local_2c0,
                   (QPDFObjectHandle *)
                   &olimits.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::allocator<char>::~allocator(&local_2c1);
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1c8);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &olimits.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else {
      QTC::TC("qpdf","NNTree unable to determine limits",0);
      qpdf = this->impl->qpdf;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e8,"unable to determine limits",&local_2e9);
      warn(qpdf,node,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::allocator<char>::~allocator(&local_2e9);
    }
    local_421 = true;
    if (first.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._3_1_) {
      local_2f8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::begin
                     (&this->path);
      local_421 = std::operator==((_Self *)&this_local,&local_2f8);
    }
    if (local_421 == false) {
      pPVar5 = std::_List_iterator<NNTreeIterator::PathElement>::operator->
                         ((_List_iterator<NNTreeIterator::PathElement> *)&this_local);
      QPDFObjectHandle::operator=(node,&pPVar5->node);
      std::_List_iterator<NNTreeIterator::PathElement>::operator--
                ((_List_iterator<NNTreeIterator::PathElement> *)&this_local);
    }
    else {
      local_21 = 1;
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d8);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &last.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_b0);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_78);
  }
  QTC::TC("qpdf","NNTree remove limits from root",0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"/Limits",&local_51);
  QPDFObjectHandle::removeKey(node,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return;
}

Assistant:

void
NNTreeIterator::resetLimits(QPDFObjectHandle node, std::list<PathElement>::iterator parent)
{
    bool done = false;
    while (!done) {
        if (parent == this->path.end()) {
            QTC::TC("qpdf", "NNTree remove limits from root");
            node.removeKey("/Limits");
            done = true;
            break;
        }
        auto kids = node.getKey("/Kids");
        int nkids = kids.isArray() ? kids.getArrayNItems() : 0;
        auto items = node.getKey(impl.details.itemsKey());
        int nitems = items.isArray() ? items.getArrayNItems() : 0;

        bool changed = true;
        QPDFObjectHandle first;
        QPDFObjectHandle last;
        if (nitems >= 2) {
            first = items.getArrayItem(0);
            last = items.getArrayItem((nitems - 1) & ~1);
        } else if (nkids > 0) {
            auto first_kid = kids.getArrayItem(0);
            auto last_kid = kids.getArrayItem(nkids - 1);
            if (first_kid.isDictionary() && last_kid.isDictionary()) {
                auto first_limits = first_kid.getKey("/Limits");
                auto last_limits = last_kid.getKey("/Limits");
                if (first_limits.isArray() && (first_limits.getArrayNItems() >= 2) &&
                    last_limits.isArray() && (last_limits.getArrayNItems() >= 2)) {
                    first = first_limits.getArrayItem(0);
                    last = last_limits.getArrayItem(1);
                }
            }
        }
        if (first && last) {
            auto limits = QPDFObjectHandle::newArray();
            limits.appendItem(first);
            limits.appendItem(last);
            auto olimits = node.getKey("/Limits");
            if (olimits.isArray() && (olimits.getArrayNItems() == 2)) {
                auto ofirst = olimits.getArrayItem(0);
                auto olast = olimits.getArrayItem(1);
                if (impl.details.keyValid(ofirst) && impl.details.keyValid(olast) &&
                    (impl.details.compareKeys(first, ofirst) == 0) &&
                    (impl.details.compareKeys(last, olast) == 0)) {
                    QTC::TC("qpdf", "NNTree limits didn't change");
                    changed = false;
                }
            }
            if (changed && !node.isSameObjectAs(path.begin()->node)) {
                node.replaceKey("/Limits", limits);
            }
        } else {
            QTC::TC("qpdf", "NNTree unable to determine limits");
            warn(impl.qpdf, node, "unable to determine limits");
        }

        if ((!changed) || (parent == this->path.begin())) {
            done = true;
        } else {
            node = parent->node;
            --parent;
        }
    }
}